

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O1

avl_node * avl_find_greaterequal(avl_tree *tree,void *key)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 in_RAX;
  avl_node *paVar3;
  avl_node *paVar4;
  int diff;
  undefined8 uStack_28;
  
  if (tree->root == (avl_node *)0x0) {
    paVar4 = (avl_node *)0x0;
  }
  else {
    uStack_28 = in_RAX;
    paVar3 = _avl_find_rec(tree->root,key,tree->comp,(int *)((long)&uStack_28 + 4));
    uVar1 = uStack_28;
    iVar2 = uStack_28._4_4_;
    while (0 < iVar2) {
      if ((avl_node *)(tree->list_head).prev == paVar3) {
        return (avl_node *)0x0;
      }
      paVar3 = (avl_node *)(paVar3->list).next;
      uStack_28 = uVar1;
      iVar2 = (*tree->comp)(key,paVar3->key);
      uStack_28 = CONCAT44(iVar2,(undefined4)uStack_28);
      uVar1 = uStack_28;
    }
    uStack_28._4_4_ = (int)((ulong)uVar1 >> 0x20);
    paVar4 = paVar3;
    iVar2 = uStack_28._4_4_;
    while ((uStack_28 = uVar1, iVar2 < 1 &&
           (paVar4 = paVar3, (avl_node *)(tree->list_head).next != paVar3))) {
      paVar3 = (avl_node *)(paVar3->list).prev;
      iVar2 = (*tree->comp)(key,paVar3->key);
      uStack_28 = CONCAT44(iVar2,(undefined4)uStack_28);
      uVar1 = uStack_28;
    }
  }
  return paVar4;
}

Assistant:

struct avl_node *
avl_find_greaterequal(const struct avl_tree *tree, const void *key) {
  struct avl_node *node, *next;
  int diff;

  if (tree->root == NULL)
    return NULL;

  node = _avl_find_rec(tree->root, key, tree->comp, &diff);

  /* go right as long as key>node.key */
  while (diff > 0) {
    if (list_is_last(&tree->list_head, &node->list)) {
      return NULL;
    }

    node = (struct avl_node *)node->list.next;
    diff = (*tree->comp)(key, node->key);
  }

  /* go left as long as key<=next_node.key */
  next = node;
  while (diff <= 0) {
    node = next;
    if (list_is_first(&tree->list_head, &node->list)) {
      break;
    }

    next = (struct avl_node *)node->list.prev;
    diff = (*tree->comp)(key, next->key);
  }
  return node;
}